

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1_lib.cc
# Opt level: O1

int ASN1_STRING_cmp(ASN1_STRING *a,ASN1_STRING *b)

{
  int iVar1;
  int iVar2;
  ulong in_RAX;
  uint8_t b_padding;
  uint8_t a_padding;
  undefined8 uStack_28;
  
  iVar1 = a->length;
  iVar2 = b->length;
  uStack_28 = in_RAX & 0xffffffffffff;
  if (a->type == 3) {
    iVar1 = asn1_bit_string_length((ASN1_BIT_STRING *)a,(uint8_t *)((long)&uStack_28 + 7));
  }
  if (b->type == 3) {
    iVar2 = asn1_bit_string_length((ASN1_BIT_STRING *)b,(uint8_t *)((long)&uStack_28 + 6));
  }
  if (iVar2 <= iVar1) {
    if (iVar2 < iVar1) {
      return 1;
    }
    if (uStack_28._7_1_ <= uStack_28._6_1_) {
      if (uStack_28._7_1_ < uStack_28._6_1_) {
        return 1;
      }
      if (iVar1 == 0) {
        iVar1 = 0;
      }
      else {
        iVar1 = memcmp(a->data,b->data,(long)iVar1);
      }
      if (iVar1 != 0) {
        return iVar1;
      }
      if (a->type < b->type) {
        return -1;
      }
      return (uint)(b->type < a->type);
    }
  }
  return -1;
}

Assistant:

int ASN1_STRING_cmp(const ASN1_STRING *a, const ASN1_STRING *b) {
  // Capture padding bits and implicit truncation in BIT STRINGs.
  int a_length = a->length, b_length = b->length;
  uint8_t a_padding = 0, b_padding = 0;
  if (a->type == V_ASN1_BIT_STRING) {
    a_length = asn1_bit_string_length(a, &a_padding);
  }
  if (b->type == V_ASN1_BIT_STRING) {
    b_length = asn1_bit_string_length(b, &b_padding);
  }

  if (a_length < b_length) {
    return -1;
  }
  if (a_length > b_length) {
    return 1;
  }
  // In a BIT STRING, the number of bits is 8 * length - padding. Invert this
  // comparison so we compare by lengths.
  if (a_padding > b_padding) {
    return -1;
  }
  if (a_padding < b_padding) {
    return 1;
  }

  int ret = OPENSSL_memcmp(a->data, b->data, a_length);
  if (ret != 0) {
    return ret;
  }

  // Comparing the type first is more natural, but this matches OpenSSL.
  if (a->type < b->type) {
    return -1;
  }
  if (a->type > b->type) {
    return 1;
  }
  return 0;
}